

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

bool __thiscall
irr::video::COpenGLSLMaterialRenderer::setPixelShaderConstant
          (COpenGLSLMaterialRenderer *this,s32 index,s32 *ints,int count)

{
  GLenum GVar1;
  SUniformInfo *pSVar2;
  COpenGLExtensionHandler *this_00;
  long lVar3;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *this_01;
  int in_ESI;
  long in_RDI;
  bool status;
  u32 in_stack_ffffffffffffff9c;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  COpenGLExtensionHandler *in_stack_ffffffffffffffb0;
  
  if ((in_ESI < 0) ||
     (pSVar2 = core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c), pSVar2->location < 0
     )) {
    return false;
  }
  pSVar2 = core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  GVar1 = pSVar2->type;
  if (GVar1 == 0x1404) {
LAB_003534ea:
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    COpenGLExtensionHandler::extGlUniform1iv
              (in_stack_ffffffffffffffb0,(GLint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
               (GLsizei)in_stack_ffffffffffffffa8,(GLint *)in_stack_ffffffffffffffa0);
  }
  else {
    if (GVar1 == 0x8b53) {
LAB_00353526:
      core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      COpenGLExtensionHandler::extGlUniform2iv
                (in_stack_ffffffffffffffb0,(GLint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (GLsizei)in_stack_ffffffffffffffa8,(GLint *)in_stack_ffffffffffffffa0);
      return true;
    }
    if (GVar1 == 0x8b54) {
LAB_0035356c:
      this_00 = (COpenGLExtensionHandler *)(*(long *)(in_RDI + 0x10) + 0x498);
      core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      COpenGLExtensionHandler::extGlUniform3iv
                (this_00,(GLint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (GLsizei)in_stack_ffffffffffffffa8,(GLint *)in_stack_ffffffffffffffa0);
      return true;
    }
    if (GVar1 != 0x8b55) {
      if (GVar1 == 0x8b56) goto LAB_003534ea;
      if (GVar1 == 0x8b57) goto LAB_00353526;
      if (GVar1 == 0x8b58) goto LAB_0035356c;
      if (GVar1 != 0x8b59) {
        if (5 < GVar1 - 0x8b5d) {
          return false;
        }
        this_01 = (array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *)
                  (*(long *)(in_RDI + 0x10) + 0x498);
        core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
                  (this_01,in_stack_ffffffffffffff9c);
        COpenGLExtensionHandler::extGlUniform1iv
                  (in_stack_ffffffffffffffb0,(GLint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (GLsizei)in_stack_ffffffffffffffa8,(GLint *)this_01);
        return true;
      }
    }
    lVar3 = *(long *)(in_RDI + 0x10) + 0x498;
    core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::operator[]
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    COpenGLExtensionHandler::extGlUniform4iv
              (in_stack_ffffffffffffffb0,(GLint)((ulong)lVar3 >> 0x20),(GLsizei)lVar3,
               (GLint *)in_stack_ffffffffffffffa0);
  }
  return true;
}

Assistant:

bool COpenGLSLMaterialRenderer::setPixelShaderConstant(s32 index, const s32 *ints, int count)
{
	if (index < 0 || UniformInfo[index].location < 0)
		return false;

	bool status = true;

	switch (UniformInfo[index].type) {
	case GL_INT:
	case GL_BOOL:
		Driver->extGlUniform1iv(UniformInfo[index].location, count, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC2:
	case GL_BOOL_VEC2:
		Driver->extGlUniform2iv(UniformInfo[index].location, count / 2, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC3:
	case GL_BOOL_VEC3:
		Driver->extGlUniform3iv(UniformInfo[index].location, count / 3, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_INT_VEC4:
	case GL_BOOL_VEC4:
		Driver->extGlUniform4iv(UniformInfo[index].location, count / 4, reinterpret_cast<const GLint *>(ints));
		break;
	case GL_SAMPLER_1D:
	case GL_SAMPLER_2D:
	case GL_SAMPLER_3D:
	case GL_SAMPLER_CUBE:
	case GL_SAMPLER_1D_SHADOW:
	case GL_SAMPLER_2D_SHADOW:
		Driver->extGlUniform1iv(UniformInfo[index].location, 1, reinterpret_cast<const GLint *>(ints));
		break;
	default:
		status = false;
		break;
	}
	return status;
}